

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::TimecodeComponent::Dump(TimecodeComponent *this,FILE *stream)

{
  undefined8 __stream;
  char *pcVar1;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  TimecodeComponent *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  StructuralComponent::Dump(&this->super_StructuralComponent,(FILE *)identbuf._120_8_);
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","RoundedTimecodeBase",
          (ulong)this->RoundedTimecodeBase);
  __stream = identbuf._120_8_;
  pcVar1 = i64sz(this->StartTimecode,local_98);
  fprintf((FILE *)__stream,"  %22s = %s\n","StartTimecode",pcVar1);
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","DropFrame",(ulong)this->DropFrame);
  return;
}

Assistant:

void
TimecodeComponent::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  StructuralComponent::Dump(stream);
  fprintf(stream, "  %22s = %d\n",  "RoundedTimecodeBase", RoundedTimecodeBase);
  fprintf(stream, "  %22s = %s\n",  "StartTimecode", i64sz(StartTimecode, identbuf));
  fprintf(stream, "  %22s = %d\n",  "DropFrame", DropFrame);
}